

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# refresh.c
# Opt level: O3

void re_fastputc(EditLine *el,wint_t c)

{
  wchar_t wVar1;
  wchar_t wVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  wint_t **ppwVar6;
  wchar_t wVar7;
  wint_t *pwVar8;
  uint uVar9;
  wint_t c_00;
  wint_t c_01;
  
  iVar3 = wcwidth(c);
  if (1 < iVar3) {
    while ((el->el_terminal).t_size.h < (el->el_cursor).h + iVar3) {
      re_fastputc(el,0x20);
    }
  }
  terminal__putc(el,c);
  wVar1 = (el->el_cursor).h;
  ppwVar6 = el->el_display;
  pwVar8 = ppwVar6[(el->el_cursor).v];
  (el->el_cursor).h = wVar1 + L'\x01';
  pwVar8[wVar1] = c;
  if (1 < iVar3) {
    uVar9 = iVar3 + 1;
    do {
      pwVar8 = ppwVar6[(el->el_cursor).v];
      wVar1 = (el->el_cursor).h;
      (el->el_cursor).h = wVar1 + L'\x01';
      pwVar8[wVar1] = 0xffffffff;
      uVar9 = uVar9 - 1;
    } while (2 < uVar9);
  }
  wVar1 = (el->el_terminal).t_size.h;
  lVar4 = (long)wVar1;
  if (wVar1 <= (el->el_cursor).h) {
    (el->el_cursor).h = L'\0';
    wVar2 = (el->el_terminal).t_size.v;
    wVar7 = (el->el_cursor).v + L'\x01';
    if (wVar7 < wVar2) {
      (el->el_cursor).v = wVar7;
      wVar2 = (el->el_refresh).r_oldcv;
      (el->el_refresh).r_oldcv = wVar2 + L'\x01';
      pwVar8 = ppwVar6[(long)wVar2 + 1];
    }
    else {
      pwVar8 = *ppwVar6;
      uVar5 = 1;
      if (L'\x01' < wVar2) {
        uVar5 = 1;
        do {
          el->el_display[uVar5 - 1] = el->el_display[uVar5];
          uVar5 = uVar5 + 1;
        } while ((uint)wVar2 != uVar5);
        ppwVar6 = el->el_display;
        uVar5 = (ulong)(uint)wVar2;
      }
      ppwVar6[uVar5 - 1] = pwVar8;
    }
    if (wVar1 != L'\0') {
      do {
        *pwVar8 = 0x20;
        pwVar8 = pwVar8 + 1;
        lVar4 = lVar4 + -1;
      } while (lVar4 != 0);
    }
    *pwVar8 = 0;
    wVar1 = (el->el_terminal).t_flags;
    if ((char)wVar1 < '\0') {
      if (((uint)wVar1 >> 8 & 1) == 0) {
        return;
      }
      c_00 = 8;
      c_01 = 0x20;
    }
    else {
      c_00 = 10;
      c_01 = 0xd;
    }
    terminal__putc(el,c_01);
    terminal__putc(el,c_00);
    return;
  }
  return;
}

Assistant:

static void
re_fastputc(EditLine *el, wint_t c)
{
	wint_t *lastline;
	int w;

	w = wcwidth(c);
	while (w > 1 && el->el_cursor.h + w > el->el_terminal.t_size.h)
	    re_fastputc(el, ' ');

	terminal__putc(el, c);
	el->el_display[el->el_cursor.v][el->el_cursor.h++] = c;
	while (--w > 0)
		el->el_display[el->el_cursor.v][el->el_cursor.h++]
			= MB_FILL_CHAR;

	if (el->el_cursor.h >= el->el_terminal.t_size.h) {
		/* if we must overflow */
		el->el_cursor.h = 0;

		/*
		 * If we would overflow (input is longer than terminal size),
		 * emulate scroll by dropping first line and shuffling the rest.
		 * We do this via pointer shuffling - it's safe in this case
		 * and we avoid memcpy().
		 */
		if (el->el_cursor.v + 1 >= el->el_terminal.t_size.v) {
			int i, lins = el->el_terminal.t_size.v;

			lastline = el->el_display[0];
			for(i = 1; i < lins; i++)
				el->el_display[i - 1] = el->el_display[i];

			el->el_display[i - 1] = lastline;
		} else {
			el->el_cursor.v++;
			lastline = el->el_display[++el->el_refresh.r_oldcv];
		}
		re__copy_and_pad((wchar_t *)lastline, L"",
		    (size_t)el->el_terminal.t_size.h);

		if (EL_HAS_AUTO_MARGINS) {
			if (EL_HAS_MAGIC_MARGINS) {
				terminal__putc(el, ' ');
				terminal__putc(el, '\b');
			}
		} else {
			terminal__putc(el, '\r');
			terminal__putc(el, '\n');
		}
	}
}